

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_getForce.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::getForce
          (NavierStokesBase *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,
          FArrayBox *State,FArrayBox *Aux,int auxScomp,MFIter *param_10)

{
  bool bVar1;
  int iVar2;
  Print *pPVar3;
  int in_ECX;
  long in_RSI;
  Array4<const_double> *this_00;
  int in_R8D;
  double extraout_XMM0_Qa;
  BaseFab<double> *in_stack_00000008;
  int in_stack_00000010;
  int n_2;
  Real max_1;
  Real min_1;
  int ncomp_scal;
  int scomp_scal;
  Array4<const_double> *aux;
  Array4<double> *frc;
  int n_1;
  int n;
  Real max;
  Real min;
  int *s_hi;
  int *s_lo;
  int *v_hi;
  int *v_lo;
  int *f_hi;
  int *f_lo;
  Real grav;
  Real *auxDataPtr;
  Real *StateDataPtr;
  undefined4 in_stack_ffffffffffffe0b8;
  int in_stack_ffffffffffffe0bc;
  Print *in_stack_ffffffffffffe0c0;
  undefined8 in_stack_ffffffffffffe0d0;
  int iVar4;
  BaseFab<double> *in_stack_ffffffffffffe0d8;
  Box *in_stack_ffffffffffffe0e0;
  Print *in_stack_ffffffffffffe0e8;
  Print *in_stack_ffffffffffffe0f0;
  anon_class_136_3_35cd8f9d *in_stack_ffffffffffffe108;
  Box *in_stack_ffffffffffffe110;
  Print *in_stack_ffffffffffffe130;
  Print *in_stack_ffffffffffffe2d8;
  undefined8 in_stack_ffffffffffffe2e0;
  int line;
  Print *in_stack_ffffffffffffe2e8;
  Print *in_stack_ffffffffffffe2f0;
  int local_18bc;
  int local_18a0;
  undefined1 local_1890 [64];
  undefined1 auStack_1850 [64];
  Real local_1810;
  Array4<const_double> local_1808;
  Array4<const_double> *local_17c8;
  Array4<double> local_17c0;
  Array4<double> *local_1780;
  double local_1778;
  double local_1770;
  int local_15dc;
  double local_15d8;
  double local_15d0;
  int local_15c4;
  int local_1434;
  undefined8 local_1430;
  undefined8 local_1428;
  int *local_338;
  int *local_330;
  int *local_328;
  int *local_320;
  int *local_318;
  int *local_310;
  Real local_308;
  double *local_300;
  double *local_2f8;
  int local_2e0;
  int local_2dc;
  long local_2d0;
  undefined8 local_2c0;
  undefined4 local_2b4;
  char *local_2b0;
  char *local_2a8;
  undefined8 local_2a0;
  undefined4 local_294;
  char *local_290;
  char *local_288;
  Array4<double> local_280;
  int local_23c;
  long local_238;
  Array4<const_double> local_230;
  int local_1ec;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffe2e0 >> 0x20);
  iVar4 = (int)((ulong)in_stack_ffffffffffffe0d0 >> 0x20);
  local_2e0 = in_R8D;
  local_2dc = in_ECX;
  local_2d0 = in_RSI;
  local_2f8 = amrex::BaseFab<double>::dataPtr(in_stack_ffffffffffffe0d8,iVar4);
  local_300 = amrex::BaseFab<double>::dataPtr(in_stack_ffffffffffffe0d8,iVar4);
  local_308 = gravity;
  bVar1 = amrex::ParallelDescriptor::IOProcessor();
  if ((bVar1) && (getForceVerbose != 0)) {
    local_310 = amrex::BaseFab<double>::loVect((BaseFab<double> *)0x7ac488);
    local_318 = amrex::BaseFab<double>::hiVect((BaseFab<double> *)0x7ac49d);
    local_320 = amrex::BaseFab<double>::loVect((BaseFab<double> *)0x7ac4b2);
    local_328 = amrex::BaseFab<double>::hiVect((BaseFab<double> *)0x7ac4c7);
    local_330 = amrex::BaseFab<double>::loVect((BaseFab<double> *)0x7ac4dc);
    local_338 = amrex::BaseFab<double>::hiVect((BaseFab<double> *)0x7ac4f1);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [41])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [13])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (double *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [13])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [13])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [12])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    if (local_2e0 == 1) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [22])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::~Print(in_stack_ffffffffffffe130);
    }
    else if ((local_2dc == 0) && (local_2e0 == 3)) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [22])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::~Print(in_stack_ffffffffffffe130);
    }
    else if (2 < local_2dc) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [7])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [39])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::~Print(in_stack_ffffffffffffe130);
    }
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [52])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (Box *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [44])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    in_stack_ffffffffffffe2f0 =
         amrex::Print::operator<<
                   (in_stack_ffffffffffffe0c0,
                    (char (*) [5])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    in_stack_ffffffffffffe2e8 =
         amrex::Print::operator<<
                   (in_stack_ffffffffffffe0c0,
                    (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    pPVar3 = amrex::Print::operator<<
                       (in_stack_ffffffffffffe0c0,
                        (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    in_stack_ffffffffffffe2d8 =
         amrex::Print::operator<<
                   (in_stack_ffffffffffffe0c0,
                    (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [42])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [5])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [43])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [5])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
    for (local_1434 = 0; local_1434 < local_2e0; local_1434 = local_1434 + 1) {
      local_1428 = 0x708420eb449c8843;
      local_1430 = 0xf08420eb449c8843;
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [12])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      local_15c4 = local_2dc + local_1434;
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [10])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      local_15d0 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                             ((BaseFab<double> *)in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc
                             );
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (double *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [4])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      local_15d8 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                             ((BaseFab<double> *)in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc
                             );
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (double *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::~Print(in_stack_ffffffffffffe130);
    }
    local_15dc = in_stack_00000010;
    while( true ) {
      iVar4 = local_15dc;
      iVar2 = amrex::BaseFab<double>::nComp(in_stack_00000008);
      line = (int)((ulong)pPVar3 >> 0x20);
      if (iVar2 <= iVar4) break;
      local_1428 = 0x708420eb449c8843;
      local_1430 = 0xf08420eb449c8843;
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [10])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [10])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      local_1770 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                             ((BaseFab<double> *)in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc
                             );
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (double *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [4])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      local_1778 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                             ((BaseFab<double> *)in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc
                             );
      in_stack_ffffffffffffe130 =
           amrex::Print::operator<<
                     (in_stack_ffffffffffffe0c0,
                      (double *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::~Print(in_stack_ffffffffffffe130);
      local_15dc = local_15dc + 1;
    }
  }
  if (local_2dc < 3) {
    if (local_2dc != 0) {
      local_288 = "scomp==Xvel";
      local_290 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
      ;
      local_294 = 0x7c;
      local_2a0 = 0;
      amrex::Assert_host((char *)in_stack_ffffffffffffe2f0,(char *)in_stack_ffffffffffffe2e8,line,
                         (char *)in_stack_ffffffffffffe2d8);
    }
    if (local_2e0 < 3) {
      local_2a8 = "ncomp>=AMREX_SPACEDIM";
      local_2b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
      ;
      local_2b4 = 0x7d;
      local_2c0 = 0;
      amrex::Assert_host((char *)in_stack_ffffffffffffe2f0,(char *)in_stack_ffffffffffffe2e8,line,
                         (char *)in_stack_ffffffffffffe2d8);
    }
  }
  if (local_2dc == 0) {
    local_238 = local_2d0;
    local_23c = local_2dc;
    local_a8 = *(double **)(local_2d0 + 0x10);
    local_b0 = (undefined8 *)(local_2d0 + 0x18);
    local_b4 = *(int *)(local_2d0 + 0x34);
    local_5c = 0;
    local_88 = *(undefined4 *)local_b0;
    local_6c = 1;
    uStack_84 = *(undefined4 *)(local_2d0 + 0x1c);
    local_d0._0_8_ = *local_b0;
    local_7c = 2;
    local_d0.z = *(int *)(local_2d0 + 0x20);
    local_8 = (int *)(local_2d0 + 0x24);
    local_c = 0;
    local_38 = *local_8 + 1;
    local_18 = local_2d0 + 0x24;
    local_1c = 1;
    iStack_34 = *(int *)(local_2d0 + 0x28) + 1;
    local_28 = local_2d0 + 0x24;
    local_2c = 2;
    local_f0.z = *(int *)(local_2d0 + 0x2c) + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_e0._0_8_ = local_f0._0_8_;
    local_e0.z = local_f0.z;
    local_c0._0_8_ = local_d0._0_8_;
    local_c0.z = local_d0.z;
    local_a0._0_8_ = local_d0._0_8_;
    local_a0.z = local_d0.z;
    local_90 = local_b0;
    local_80 = local_d0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    amrex::Array4<double>::Array4(&local_280,local_a8,&local_c0,&local_e0,local_b4);
    amrex::Array4<double>::Array4<double,_0>(&local_17c0,&local_280,local_23c);
    local_1ec = in_stack_00000010;
    local_198 = in_stack_00000008->dptr;
    local_1a0 = &in_stack_00000008->domain;
    local_1a4 = in_stack_00000008->nvar;
    local_14c = 0;
    local_178 = (local_1a0->smallend).vect[0];
    local_15c = 1;
    iStack_174 = (in_stack_00000008->domain).smallend.vect[1];
    local_1c0.x = (local_1a0->smallend).vect[0];
    local_1c0.y = (local_1a0->smallend).vect[1];
    local_16c = 2;
    local_1c0.z = (in_stack_00000008->domain).smallend.vect[2];
    local_f8 = &(in_stack_00000008->domain).bigend;
    local_fc = 0;
    local_128 = local_f8->vect[0] + 1;
    local_108 = &(in_stack_00000008->domain).bigend;
    local_10c = 1;
    iStack_124 = (in_stack_00000008->domain).bigend.vect[1] + 1;
    local_118 = &(in_stack_00000008->domain).bigend;
    local_11c = 2;
    local_1e0.z = (in_stack_00000008->domain).bigend.vect[2] + 1;
    local_1e0.y = iStack_124;
    local_1e0.x = local_128;
    local_1780 = &local_17c0;
    local_1cc._0_8_ = local_1e0._0_8_;
    local_1cc.z = local_1e0.z;
    local_1b0._0_8_ = local_1c0._0_8_;
    local_1b0.z = local_1c0.z;
    local_190._0_8_ = local_1c0._0_8_;
    local_190.z = local_1c0.z;
    local_180 = local_1a0;
    local_170 = local_1c0.z;
    local_168 = local_1a0;
    local_158 = local_1a0;
    local_148 = local_1a0;
    local_140._0_8_ = local_1e0._0_8_;
    local_140.z = local_1e0.z;
    local_130 = local_1a0;
    local_120 = local_1e0.z;
    amrex::Array4<const_double>::Array4(&local_230,local_198,&local_1b0,&local_1cc,local_1a4);
    this_00 = &local_1808;
    amrex::Array4<const_double>::Array4<const_double,_0>(this_00,&local_230,local_1ec);
    local_17c8 = &local_1808;
    std::abs((int)this_00);
    if (extraout_XMM0_Qa <= 0.0001) {
      amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                ((BaseFab<double> *)in_stack_ffffffffffffe0f0,(double *)in_stack_ffffffffffffe0e8,
                 in_stack_ffffffffffffe0e0,(int)((ulong)in_stack_ffffffffffffe0d8 >> 0x20),
                 (int)in_stack_ffffffffffffe0d8);
    }
    else {
      memcpy(local_1890,local_1780,0x3c);
      memcpy(auStack_1850,local_17c8,0x3c);
      local_1810 = local_308;
      amrex::
      ParallelFor<NavierStokesBase::getForce(amrex::FArrayBox&,amrex::Box_const&,int,int,double,amrex::FArrayBox_const&,amrex::FArrayBox_const&,int,amrex::MFIter_const&)::__0>
                (in_stack_ffffffffffffe110,in_stack_ffffffffffffe108);
    }
  }
  local_18a0 = -1;
  if (local_2dc < 3) {
    if (3 < local_2dc + local_2e0) {
      local_18a0 = local_2e0 + -3;
    }
  }
  else {
    local_18a0 = local_2e0;
  }
  if (0 < local_18a0) {
    amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
              ((BaseFab<double> *)in_stack_ffffffffffffe0f0,(double *)in_stack_ffffffffffffe0e8,
               in_stack_ffffffffffffe0e0,(int)((ulong)in_stack_ffffffffffffe0d8 >> 0x20),
               (int)in_stack_ffffffffffffe0d8);
  }
  bVar1 = amrex::ParallelDescriptor::IOProcessor();
  if ((bVar1) && (getForceVerbose != 0)) {
    for (local_18bc = 0; local_18bc < local_2e0; local_18bc = local_18bc + 1) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [12])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (int *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (char (*) [10])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::BaseFab<double>::min<(amrex::RunOn)0>
                ((BaseFab<double> *)in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc);
      in_stack_ffffffffffffe0f0 =
           amrex::Print::operator<<
                     (in_stack_ffffffffffffe0c0,
                      (double *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      in_stack_ffffffffffffe0e8 =
           amrex::Print::operator<<
                     (in_stack_ffffffffffffe0c0,
                      (char (*) [4])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::BaseFab<double>::max<(amrex::RunOn)0>
                ((BaseFab<double> *)in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc);
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (double *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::operator<<
                (in_stack_ffffffffffffe0c0,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
      amrex::Print::~Print(in_stack_ffffffffffffe130);
    }
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe0f0,(ostream *)in_stack_ffffffffffffe0e8);
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (char (*) [41])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::operator<<
              (in_stack_ffffffffffffe0c0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    pPVar3 = amrex::Print::operator<<
                       (in_stack_ffffffffffffe0c0,
                        (char (*) [4])CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8))
    ;
    amrex::Print::operator<<
              (pPVar3,(_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                       *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8));
    amrex::Print::~Print(in_stack_ffffffffffffe130);
  }
  return;
}

Assistant:

void
NavierStokesBase::getForce (FArrayBox&       force,
                            const Box&       bx,
                            int              scomp,
                            int              ncomp,
                            const Real       time,
                            const FArrayBox& State,
                            const FArrayBox& Aux,
                            int              auxScomp,
                            const MFIter&    /*mfi*/)
{

   const Real* StateDataPtr  = State.dataPtr();
   const Real* auxDataPtr = Aux.dataPtr(auxScomp);

   const Real  grav     = gravity;

   if (ParallelDescriptor::IOProcessor() && getForceVerbose)
   {
       const int*  f_lo     = force.loVect();
       const int*  f_hi     = force.hiVect();
       const int*  v_lo     = State.loVect();
       const int*  v_hi     = State.hiVect();
       const int*  s_lo     = Aux.loVect();
       const int*  s_hi     = Aux.hiVect();
       
       amrex::Print() << "NavierStokesBase::getForce(): Entered..." << std::endl 
		      << "time      = " << time << std::endl
		      << "scomp     = " << scomp << std::endl
		      << "ncomp     = " << ncomp << std::endl
		      << "auxScomp = " << auxScomp << std::endl;
       
       if  (ncomp==1) amrex::Print() << "Doing only component " << scomp << std::endl;
       else if (scomp==0 && ncomp==AMREX_SPACEDIM) amrex::Print() << "Doing velocities only" << std::endl;
       else if (scomp>=AMREX_SPACEDIM) amrex::Print() << "Doing " << ncomp << " component(s) starting with component " << scomp << std::endl;

       amrex::Print() << "NavierStokesBase::getForce(): Filling Force on box:"
		      << bx << std::endl;
#if (AMREX_SPACEDIM == 3)
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << "," << f_lo[2] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << "," << f_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Vel Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << "," << v_lo[2] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << "," << v_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Scal Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << "," << s_lo[2] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << "," << s_hi[2] << ")" << std::endl;
#else
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): State Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Aux Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << ")" << std::endl;
#endif

       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "State comp " << scomp+n << " min/max " 
			  << State.min<RunOn::Gpu>(scomp+n) << " / "
			  << State.max<RunOn::Gpu>(scomp+n) << std::endl;
       }
       for (int n=auxScomp; n<Aux.nComp(); n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "aux comp " << n << " min/max " 
			  << Aux.min<RunOn::Gpu>(n) << " / "
			  << Aux.max<RunOn::Gpu>(n) << std::endl;
       }
   } //end if(getForceVerbose)

   //
   // Here's the meat
   //
   // Velocity forcing
   //
   if ( scomp<AMREX_SPACEDIM ){
       AMREX_ALWAYS_ASSERT(scomp==Xvel);
       AMREX_ALWAYS_ASSERT(ncomp>=AMREX_SPACEDIM);
   }

   if ( scomp==Xvel ){
     //
     // TODO: add some switch for user-supplied/problem-dependent forcing
     //
     auto const& frc = force.array(scomp);
     auto const& aux = Aux.array(auxScomp);

     if ( std::abs(grav) > 0.0001) {
       amrex::ParallelFor(bx, [frc, aux, grav]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
	 frc(i,j,k,0) = Real(0.0);
#if ( AMREX_SPACEDIM == 2 )
         frc(i,j,k,1) = grav*aux(i,j,k,0);
#elif ( AMREX_SPACEDIM == 3 )
         frc(i,j,k,1) = Real(0.0);
         frc(i,j,k,2) = grav*aux(i,j,k,0);
#endif
       });
     }
     else {
       force.setVal<RunOn::Gpu>(0.0, bx, Xvel, AMREX_SPACEDIM);
     }
   }

   //
   // Scalar forcing
   //
   // During a regular timestep, getForce is called on scalars only.
   // During the multilevel sync, scalars are done with velocity.
   //
   int scomp_scal = -1;
   int ncomp_scal = -1;
   if ( scomp >= AMREX_SPACEDIM ) {
       // Doing only scalars
       scomp_scal = 0;
       ncomp_scal = ncomp;
   }
   // Recall that we will only get here if previous block is false,
   // i.e. if scomp < AMREX_SPACEDIM
   else if ( scomp+ncomp > AMREX_SPACEDIM) {
       // Doing scalars with vel
       scomp_scal = Density;
       ncomp_scal = ncomp-Density;
   }

   if (ncomp_scal > 0) {
       force.setVal<RunOn::Gpu>(0.0, bx, scomp_scal, ncomp_scal);
       //
       // Or create user-defined forcing.
       // Recall we compute a density-weighted forcing term.
       //
       // auto const& frc  = force.array(scomp_scal);
       // amrex::ParallelFor(bx, ncomp_scal, [frc]
       // AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       // {
       //          frc(i,j,k,n) = ;
       //          frc(i,j,k,n) *= rho;
       // });
   }
     
   if (ParallelDescriptor::IOProcessor() && getForceVerbose) {
       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "Force comp " << scomp+n << " min/max " 
			  << force.min<RunOn::Gpu>(scomp+n) << " / "
			  << force.max<RunOn::Gpu>(scomp+n) << std::endl;
       }

      amrex::Print() << "NavierStokesBase::getForce(): Leaving..." 
                     << std::endl << "---" << std::endl;
   }
}